

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::VerifyAllConnects(TPZCheckMesh *this)

{
  int iVar1;
  int64_t iVar2;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  int unaff_retaddr;
  TPZCheckMesh *in_stack_00000008;
  int check;
  int i;
  int ncon;
  int in_stack_0000018c;
  TPZCheckMesh *in_stack_00000190;
  int local_14;
  int local_10;
  
  iVar2 = TPZCompMesh::NConnects((TPZCompMesh *)0x19f071b);
  local_14 = 1;
  local_10 = 0;
  do {
    if ((int)iVar2 <= local_10) {
      return local_14;
    }
    iVar1 = VerifyConnect(in_stack_00000190,in_stack_0000018c);
    if (iVar1 == 0) {
LAB_019f075f:
      local_14 = 0;
      this_00 = std::operator<<(*(ostream **)(in_RDI + 8),"Check failed for connect: ");
      this_01 = (void *)std::ostream::operator<<(this_00,local_10);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    else {
      iVar1 = VerifyCompatibilityBetweenNShapesAndBlockSize(in_stack_00000008,unaff_retaddr);
      if (iVar1 == 0) goto LAB_019f075f;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int TPZCheckMesh::VerifyAllConnects() {
	int ncon = fMesh->NConnects();
	int i;
	int check = 1;
	for (i=0; i<ncon; i++){
		//(*fOut) << "Startint to check consistency for connect " << i << endl;
		if (!VerifyConnect(i) || !VerifyCompatibilityBetweenNShapesAndBlockSize(i)) {
			check = 0;
			(*fOut) << "Check failed for connect: " << i << endl;
		}
	}
	return check;
}